

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadElemSection(BinaryReader *this,Offset section_size)

{
  int iVar1;
  Result RVar2;
  ExternalKind EVar3;
  ulong uVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  uint32_t flags;
  Opcode opcode;
  Index num_elem_exprs;
  Index num_elem_segments;
  Type elem_type;
  uint32_t value;
  uint local_80;
  Opcode local_7c;
  ExternalKind local_78;
  uint local_74;
  Type local_70 [2];
  ExternalKind local_5c;
  string local_58;
  ulong local_38;
  
  iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x8e])();
  if (iVar1 == 0) {
    RVar2 = ReadCount(this,&local_74,"elem segment count");
    if (RVar2.enum_ != Error) {
      iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x8f])(this->delegate_,(ulong)local_74);
      if (iVar1 == 0) {
        bVar8 = local_74 != 0;
        if (bVar8) {
          uVar7 = 0;
          do {
            RVar2 = ReadU32Leb128(this,&local_80,"elem segment flags");
            if (RVar2.enum_ == Error) goto LAB_00127658;
            if (local_80 < 8) {
              uVar4 = 0;
              if ((local_80 & 3) == 2) {
                RVar2 = ReadU32Leb128(this,(uint32_t *)&local_58,"elem segment table index");
                bVar9 = false;
                if (RVar2.enum_ == Error) goto LAB_001276e8;
                uVar4 = (ulong)(uint)local_58._M_dataplus._M_p;
              }
              local_70[0].enum_ = FuncRef;
              local_70[0].type_index_ = 0xffffffff;
              iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x90])
                                (this->delegate_,uVar7,uVar4);
              if (iVar1 == 0) {
                pcVar5 = extraout_RDX;
                if ((local_80 & 1) == 0) {
                  iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x91])
                                    (this->delegate_,uVar7);
                  if (iVar1 == 0) {
                    bVar9 = false;
                    RVar2 = ReadInstructions(this,true,this->read_end_,(Opcode *)0x0);
                    if (RVar2.enum_ == Error) goto LAB_001276e8;
                    iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x92])
                                      (this->delegate_,uVar7);
                    pcVar5 = extraout_RDX_00;
                    if (iVar1 == 0) goto LAB_00127772;
                    pcVar5 = "EndElemSegmentInitExpr callback failed";
                  }
                  else {
                    pcVar5 = "BeginElemSegmentInitExpr callback failed";
                  }
                }
                else {
LAB_00127772:
                  if ((local_80 & 3) != 0) {
                    if ((local_80 & 4) == 0) {
                      RVar2 = ReadExternalKind(this,&local_78,pcVar5);
                      if (RVar2.enum_ != Error) {
                        if (local_78 == First) {
                          local_70[0].enum_ = FuncRef;
                          local_70[0].type_index_ = 0xffffffff;
                          goto LAB_0012780e;
                        }
                        Type::GetName_abi_cxx11_(&local_58,local_70);
                        PrintError(this,"segment elem type must be func (%s)",
                                   CONCAT44(local_58._M_dataplus._M_p._4_4_,
                                            (uint)local_58._M_dataplus._M_p));
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_58._M_dataplus._M_p._4_4_,
                                        (uint)local_58._M_dataplus._M_p) != &local_58.field_2) {
                          operator_delete((undefined1 *)
                                          CONCAT44(local_58._M_dataplus._M_p._4_4_,
                                                   (uint)local_58._M_dataplus._M_p),
                                          local_58.field_2._M_allocated_capacity + 1);
                        }
                      }
                    }
                    else {
                      RVar2 = ReadRefType(this,local_70,"table elem type");
                      if (RVar2.enum_ != Error) goto LAB_0012780e;
                    }
LAB_00127658:
                    bVar9 = false;
                    goto LAB_001276e8;
                  }
LAB_0012780e:
                  iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x93])
                                    (this->delegate_,uVar7,local_70[0]);
                  if (iVar1 == 0) {
                    RVar2 = ReadCount(this,&local_78,"elem count");
                    EVar3 = local_78;
                    if (RVar2.enum_ == Error) goto LAB_00127658;
                    iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x94])
                                      (this->delegate_,uVar7,(ulong)local_78);
                    if (iVar1 == 0) {
                      bVar9 = EVar3 != First;
                      if (bVar9) {
                        local_5c = EVar3;
                        local_38 = (ulong)-EVar3;
                        EVar3 = Table;
                        do {
                          if ((local_80 & 4) == 0) {
                            RVar2 = ReadU32Leb128(this,(uint32_t *)&local_58,"elem expr func index")
                            ;
                            if (RVar2.enum_ == Error) break;
                            iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x96])
                                              (this->delegate_,uVar7);
                            if (iVar1 != 0) {
LAB_001279f3:
                              pcVar5 = "OnElemSegmentElemExpr_RefFunc callback failed";
LAB_00127a15:
                              PrintError(this,pcVar5);
                              break;
                            }
                          }
                          else {
                            RVar2 = ReadOpcode(this,&local_7c,"elem expr opcode");
                            if (RVar2.enum_ == Error) break;
                            if (local_7c.enum_ == RefFunc) {
                              RVar2 = ReadU32Leb128(this,(uint32_t *)&local_58,
                                                    "elem expr func index");
                              if (RVar2.enum_ == Error) break;
                              iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x96])
                                                (this->delegate_,uVar7);
                              if (iVar1 != 0) goto LAB_001279f3;
                            }
                            else if (local_7c.enum_ == RefNull) {
                              RVar2 = ReadRefType(this,(Type *)&local_58,"elem expr ref.null type");
                              if (RVar2.enum_ == Error) break;
                              iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x95])
                                                (this->delegate_,uVar7,
                                                 CONCAT44(local_58._M_dataplus._M_p._4_4_,
                                                          (uint)local_58._M_dataplus._M_p));
                              if (iVar1 != 0) {
                                pcVar5 = "OnElemSegmentElemExpr_RefNull callback failed";
                                goto LAB_00127a15;
                              }
                            }
                            else {
                              PrintError(this,
                                         "expected ref.null or ref.func in passive element segment")
                              ;
                            }
                            RVar2 = ReadOpcode(this,&local_7c,"opcode");
                            if (RVar2.enum_ == Error) break;
                            if (local_7c.enum_ != End) {
                              pcVar5 = "expected END opcode after element expression";
                              goto LAB_00127a15;
                            }
                          }
                          bVar9 = EVar3 < local_5c;
                          iVar1 = (int)local_38 + EVar3;
                          EVar3 = EVar3 + Table;
                        } while (iVar1 != 0);
                      }
                      if (bVar9) goto LAB_00127658;
                      iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x97])
                                        (this->delegate_,uVar7);
                      if (iVar1 == 0) {
                        bVar9 = true;
                        goto LAB_001276e8;
                      }
                      pcVar5 = "EndElemSegment callback failed";
                    }
                    else {
                      pcVar5 = "OnElemSegmentElemExprCount callback failed";
                    }
                  }
                  else {
                    pcVar5 = "OnElemSegmentElemType callback failed";
                  }
                }
              }
              else {
                pcVar5 = "BeginElemSegment callback failed";
              }
              bVar9 = false;
              PrintError(this,pcVar5);
            }
            else {
              bVar9 = false;
              PrintError(this,"invalid elem segment flags: %#x",(ulong)local_80);
            }
LAB_001276e8:
            if (!bVar9) break;
            uVar6 = (int)uVar7 + 1;
            uVar7 = (ulong)uVar6;
            bVar8 = uVar6 < local_74;
          } while (bVar8);
        }
        if (bVar8) {
          return (Result)Error;
        }
        iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x98])();
        if (iVar1 == 0) {
          return (Result)Ok;
        }
        pcVar5 = "EndElemSection callback failed";
      }
      else {
        pcVar5 = "OnElemSegmentCount callback failed";
      }
      PrintError(this,pcVar5);
    }
  }
  else {
    PrintError(this,"BeginElemSection callback failed");
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadElemSection(Offset section_size) {
  CALLBACK(BeginElemSection, section_size);
  Index num_elem_segments;
  CHECK_RESULT(ReadCount(&num_elem_segments, "elem segment count"));
  CALLBACK(OnElemSegmentCount, num_elem_segments);
  for (Index i = 0; i < num_elem_segments; ++i) {
    uint32_t flags;
    CHECK_RESULT(ReadU32Leb128(&flags, "elem segment flags"));
    ERROR_IF(flags > SegFlagMax, "invalid elem segment flags: %#x", flags);
    Index table_index(0);
    if ((flags & (SegPassive | SegExplicitIndex)) == SegExplicitIndex) {
      CHECK_RESULT(ReadIndex(&table_index, "elem segment table index"));
    }
    Type elem_type = Type::FuncRef;

    CALLBACK(BeginElemSegment, i, table_index, flags);

    if (!(flags & SegPassive)) {
      CALLBACK(BeginElemSegmentInitExpr, i);
      CHECK_RESULT(ReadInitExpr(i));
      CALLBACK(EndElemSegmentInitExpr, i);
    }

    // For backwards compat we support not declaring the element kind.
    if (flags & (SegPassive | SegExplicitIndex)) {
      if (flags & SegUseElemExprs) {
        CHECK_RESULT(ReadRefType(&elem_type, "table elem type"));
      } else {
        ExternalKind kind;
        CHECK_RESULT(ReadExternalKind(&kind, "export kind"));
        ERROR_UNLESS(kind == ExternalKind::Func,
                     "segment elem type must be func (%s)",
                     elem_type.GetName().c_str());
        elem_type = Type::FuncRef;
      }
    }

    CALLBACK(OnElemSegmentElemType, i, elem_type);

    Index num_elem_exprs;
    CHECK_RESULT(ReadCount(&num_elem_exprs, "elem count"));

    CALLBACK(OnElemSegmentElemExprCount, i, num_elem_exprs);
    for (Index j = 0; j < num_elem_exprs; ++j) {
      if (flags & SegUseElemExprs) {
        Opcode opcode;
        CHECK_RESULT(ReadOpcode(&opcode, "elem expr opcode"));
        if (opcode == Opcode::RefNull) {
          Type type;
          CHECK_RESULT(ReadRefType(&type, "elem expr ref.null type"));
          CALLBACK(OnElemSegmentElemExpr_RefNull, i, type);
        } else if (opcode == Opcode::RefFunc) {
          Index func_index;
          CHECK_RESULT(ReadIndex(&func_index, "elem expr func index"));
          CALLBACK(OnElemSegmentElemExpr_RefFunc, i, func_index);
        } else {
          PrintError(
              "expected ref.null or ref.func in passive element segment");
        }
        CHECK_RESULT(ReadOpcode(&opcode, "opcode"));
        ERROR_UNLESS(opcode == Opcode::End,
                     "expected END opcode after element expression");
      } else {
        Index func_index;
        CHECK_RESULT(ReadIndex(&func_index, "elem expr func index"));
        CALLBACK(OnElemSegmentElemExpr_RefFunc, i, func_index);
      }
    }
    CALLBACK(EndElemSegment, i);
  }
  CALLBACK0(EndElemSection);
  return Result::Ok;
}